

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectorFederateManager.cpp
# Opt level: O0

Filter * __thiscall
helics::ConnectorFederateManager::registerFilter
          (ConnectorFederateManager *this,string_view name,string_view type_in,string_view type_out)

{
  string_view message;
  string_view searchValue;
  string_view searchValue_00;
  bool bVar1;
  InterfaceHandle IVar2;
  StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>
  *pSVar3;
  pointer this_00;
  StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>
  *this_01;
  basic_string_view<char,_std::char_traits<char>_> *this_02;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  handle filts;
  Filter *filt;
  __single_object filtPtr;
  InterfaceHandle handle;
  char *in_stack_fffffffffffffe98;
  unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffea8;
  type pFVar4;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  shared_guarded_opt<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
  *in_stack_fffffffffffffec8;
  StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>
  *in_stack_fffffffffffffed0;
  Federate **in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  long *plVar5;
  lock_handle<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
  local_98;
  type local_70;
  InterfaceHandle local_2c [7];
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_2c[0].hid =
       (**(code **)(*(long *)*in_RDI + 0x1d8))((long *)*in_RDI,in_RSI,in_RDX,in_RCX,in_R8);
  bVar1 = InterfaceHandle::isValid(local_2c);
  if (!bVar1) {
    this_02 = (basic_string_view<char,_std::char_traits<char>_> *)__cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (this_02,in_stack_fffffffffffffe98);
    message._M_str._0_7_ = in_stack_fffffffffffffeb0;
    message._M_len = in_stack_fffffffffffffea8;
    message._M_str._7_1_ = in_stack_fffffffffffffeb7;
    RegistrationFailure::RegistrationFailure((RegistrationFailure *)this_02,message);
    __cxa_throw(this_02,&RegistrationFailure::typeinfo,RegistrationFailure::~RegistrationFailure);
  }
  std::
  make_unique<helics::Filter,helics::Federate*&,std::basic_string_view<char,std::char_traits<char>>&,helics::InterfaceHandle&>
            (in_stack_fffffffffffffed8,
             (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffed0,
             (InterfaceHandle *)in_stack_fffffffffffffec8);
  local_70 = std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>::operator*
                       ((unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *)
                        in_stack_00000010);
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
  ::lock(in_stack_fffffffffffffec8);
  bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_10);
  if (bVar1) {
    pSVar3 = gmlc::libguarded::
             lock_handle<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
             ::operator->(&local_98);
    plVar5 = (long *)*in_RDI;
    this_00 = std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>::operator->
                        ((unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *)
                         0x3e0cd5);
    IVar2 = Interface::getHandle(&this_00->super_Interface);
    this_01 = (StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>
               *)(**(code **)(*plVar5 + 0x140))(plVar5,IVar2.hid);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_00000010);
    searchValue._M_str = (char *)plVar5;
    searchValue._M_len = (size_t)pSVar3;
    gmlc::containers::
    StringMappedVector<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>,(reference_stability)0,5>
    ::insert<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>>
              (this_01,searchValue,
               (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *)
               in_stack_fffffffffffffec8);
  }
  else {
    gmlc::libguarded::
    lock_handle<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
    ::operator->(&local_98);
    searchValue_00._M_str = in_stack_fffffffffffffee0;
    searchValue_00._M_len = (size_t)in_stack_fffffffffffffed8;
    gmlc::containers::
    StringMappedVector<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>,(reference_stability)0,5>
    ::insert<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>>
              (in_stack_fffffffffffffed0,searchValue_00,
               (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *)
               in_stack_fffffffffffffec8);
  }
  pFVar4 = local_70;
  gmlc::libguarded::
  lock_handle<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
  ::~lock_handle((lock_handle<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
                  *)0x3e0e2a);
  std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>::~unique_ptr
            (in_stack_fffffffffffffea0);
  return pFVar4;
}

Assistant:

Filter& ConnectorFederateManager::registerFilter(std::string_view name,
                                                 std::string_view type_in,
                                                 std::string_view type_out)
{
    auto handle = coreObject->registerFilter(name, type_in, type_out);
    if (handle.isValid()) {
        auto filtPtr = std::make_unique<Filter>(fed, name, handle);
        Filter& filt = *filtPtr;
        auto filts = filters.lock();
        if (name.empty()) {
            filts->insert(coreObject->getHandleName(filtPtr->getHandle()), std::move(filtPtr));
        } else {
            filts->insert(name, std::move(filtPtr));
        }
        return filt;
    }
    throw(RegistrationFailure("Unable to register Filter"));
}